

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerTee(I64ToI32Lowering *this,LocalSet *curr)

{
  Index IVar1;
  Index index;
  pointer pBVar2;
  pointer this_00;
  LocalGet *value;
  Block *expression;
  Block *result;
  LocalGet *local_98;
  LocalGet *getLow;
  LocalSet *local_88;
  LocalSet *setHigh;
  LocalSet *setLow;
  Type local_60;
  undefined1 local_58 [8];
  TempVar tmp;
  TempVar highBits;
  LocalSet *curr_local;
  I64ToI32Lowering *this_local;
  
  fetchOutParam((TempVar *)&tmp.ty,this,curr->value);
  wasm::Type::Type(&local_60,i32);
  getTemp((TempVar *)local_58,this,local_60);
  wasm::Type::Type((Type *)&setLow,i32);
  (curr->super_SpecificExpression<(wasm::Expression::Id)9>).super_Expression.type.id =
       (uintptr_t)setLow;
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  setHigh = Builder::makeLocalSet(pBVar2,IVar1,(Expression *)curr);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = curr->index;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                      (&this->builder);
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)&tmp.ty);
  wasm::Type::Type((Type *)&getLow,i32);
  value = Builder::makeLocalGet(this_00,index,(Type)getLow);
  local_88 = Builder::makeLocalSet(pBVar2,IVar1 + 1,(Expression *)value);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  IVar1 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_58);
  wasm::Type::Type((Type *)&result,i32);
  local_98 = Builder::makeLocalGet(pBVar2,IVar1,(Type)result);
  pBVar2 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                     (&this->builder);
  expression = Builder::blockify<wasm::LocalGet*>
                         (pBVar2,(Expression *)setHigh,(Expression *)local_88,local_98);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)expression);
  setOutParam(this,(Expression *)expression,(TempVar *)&tmp.ty);
  TempVar::~TempVar((TempVar *)local_58);
  TempVar::~TempVar((TempVar *)&tmp.ty);
  return;
}

Assistant:

void lowerTee(LocalSet* curr) {
    TempVar highBits = fetchOutParam(curr->value);
    TempVar tmp = getTemp();
    curr->type = Type::i32;
    LocalSet* setLow = builder->makeLocalSet(tmp, curr);
    LocalSet* setHigh = builder->makeLocalSet(
      curr->index + 1, builder->makeLocalGet(highBits, Type::i32));
    LocalGet* getLow = builder->makeLocalGet(tmp, Type::i32);
    Block* result = builder->blockify(setLow, setHigh, getLow);
    replaceCurrent(result);
    setOutParam(result, std::move(highBits));
  }